

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

bool testing::internal::UnitTestOptions::FilterMatchesTest(string *test_case_name,string *test_name)

{
  size_type *psVar1;
  size_type *psVar2;
  pointer pcVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  char *pcVar6;
  size_t sVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  char *pcVar9;
  _Alloc_hider __len1;
  size_type __len2;
  undefined1 local_b8 [8];
  string negative;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string positive;
  
  psVar1 = &positive._M_string_length;
  pcVar3 = (test_case_name->_M_dataplus)._M_p;
  local_50 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar3,pcVar3 + test_case_name->_M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,".");
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                      (test_name->_M_dataplus)._M_p);
  local_90._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar8 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == paVar8) {
    local_90.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_90._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  if (local_50 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_50,
                    CONCAT71(positive._M_string_length._1_7_,(undefined1)positive._M_string_length)
                    + 1);
  }
  pcVar9 = FLAGS_gtest_filter_abi_cxx11_;
  pcVar6 = strchr(FLAGS_gtest_filter_abi_cxx11_,0x2d);
  positive._M_dataplus._M_p = (pointer)0x0;
  positive._M_string_length._0_1_ = 0;
  psVar2 = &negative._M_string_length;
  negative._M_dataplus._M_p = (pointer)0x0;
  negative._M_string_length._0_1_ = 0;
  local_b8 = (undefined1  [8])psVar2;
  if (pcVar6 == (char *)0x0) {
    local_50 = (undefined1  [8])psVar1;
    sVar7 = strlen(pcVar9);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,0,0,
               pcVar9,sVar7);
    pcVar9 = "";
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8;
    __len2 = 0;
    __len1 = negative._M_dataplus;
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_50 = (undefined1  [8])psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar9,pcVar6);
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (pbVar5,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    negative.field_2._8_8_ = pcVar6 + 1;
    sVar7 = strlen((char *)negative.field_2._8_8_);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,negative.field_2._8_8_,pcVar6 + sVar7 + 1);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
               &local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (positive._M_dataplus._M_p != (pointer)0x0) goto LAB_00a42451;
    __len2 = 1;
    pcVar9 = "*";
    __len1._M_p = (pointer)0x0;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (pbVar5,0,(size_type)__len1._M_p,pcVar9,__len2);
LAB_00a42451:
  bVar4 = MatchesFilter(&local_90,(char *)local_50);
  if (bVar4) {
    bVar4 = MatchesFilter(&local_90,(char *)local_b8);
    bVar4 = !bVar4;
  }
  else {
    bVar4 = false;
  }
  if (local_b8 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_b8,
                    CONCAT71(negative._M_string_length._1_7_,(undefined1)negative._M_string_length)
                    + 1);
  }
  if (local_50 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_50,
                    CONCAT71(positive._M_string_length._1_7_,(undefined1)positive._M_string_length)
                    + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool UnitTestOptions::FilterMatchesTest(const std::string &test_case_name,
                                        const std::string &test_name) {
  const std::string& full_name = test_case_name + "." + test_name.c_str();

  // Split --gtest_filter at '-', if there is one, to separate into
  // positive filter and negative filter portions
  const char* const p = GTEST_FLAG(filter).c_str();
  const char* const dash = strchr(p, '-');
  std::string positive;
  std::string negative;
  if (dash == NULL) {
    positive = GTEST_FLAG(filter).c_str();  // Whole string is a positive filter
    negative = "";
  } else {
    positive = std::string(p, dash);   // Everything up to the dash
    negative = std::string(dash + 1);  // Everything after the dash
    if (positive.empty()) {
      // Treat '-test1' as the same as '*-test1'
      positive = kUniversalFilter;
    }
  }

  // A filter is a colon-separated list of patterns.  It matches a
  // test if any pattern in it matches the test.
  return (MatchesFilter(full_name, positive.c_str()) &&
          !MatchesFilter(full_name, negative.c_str()));
}